

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O2

void extent_heap_remove(extent_heap_t *ph,extent_t *phn)

{
  extent_t *peVar1;
  int iVar2;
  extent_t *peVar3;
  extent_t *peVar4;
  extent_t *peVar5;
  extent_t *peVar6;
  extent_t *peVar7;
  extent_t **ppeVar8;
  extent_t *peVar9;
  
  peVar4 = ph->ph_root;
  if (peVar4 == phn) {
    if ((phn->ph_link).phn_lchild == (extent_t *)0x0) {
      peVar4 = (phn->ph_link).phn_next;
      ph->ph_root = peVar4;
      if (peVar4 == (extent_t *)0x0) {
        return;
      }
      (peVar4->ph_link).phn_prev = (extent_t *)0x0;
      return;
    }
    peVar3 = (peVar4->ph_link).phn_next;
    if (peVar3 != (extent_t *)0x0) {
      (peVar4->ph_link).phn_prev = (extent_t *)0x0;
      (peVar4->ph_link).phn_next = (extent_t *)0x0;
      (peVar3->ph_link).phn_prev = (extent_t *)0x0;
      peVar7 = (peVar3->ph_link).phn_next;
      if (peVar7 == (extent_t *)0x0) {
LAB_001224f7:
        iVar2 = extent_snad_comp(peVar4,peVar3);
        if (iVar2 < 0) {
          (peVar3->ph_link).phn_prev = peVar4;
          peVar7 = (peVar4->ph_link).phn_lchild;
          (peVar3->ph_link).phn_next = peVar7;
          if (peVar7 != (extent_t *)0x0) {
            (peVar7->ph_link).phn_prev = peVar3;
          }
          (peVar4->ph_link).phn_lchild = peVar3;
          goto LAB_00122544;
        }
        (peVar4->ph_link).phn_prev = peVar3;
        peVar7 = (peVar3->ph_link).phn_lchild;
        (peVar4->ph_link).phn_next = peVar7;
        if (peVar7 != (extent_t *)0x0) {
          (peVar7->ph_link).phn_prev = peVar4;
        }
        (peVar3->ph_link).phn_lchild = peVar4;
      }
      else {
        peVar6 = (peVar7->ph_link).phn_next;
        if (peVar6 != (extent_t *)0x0) {
          (peVar6->ph_link).phn_prev = (extent_t *)0x0;
        }
        (peVar3->ph_link).phn_prev = (extent_t *)0x0;
        (peVar3->ph_link).phn_next = (extent_t *)0x0;
        (peVar7->ph_link).phn_prev = (extent_t *)0x0;
        (peVar7->ph_link).phn_next = (extent_t *)0x0;
        iVar2 = extent_snad_comp(peVar3,peVar7);
        if (iVar2 < 0) {
          (peVar7->ph_link).phn_prev = peVar3;
          peVar9 = (peVar3->ph_link).phn_lchild;
          (peVar7->ph_link).phn_next = peVar9;
          if (peVar9 != (extent_t *)0x0) {
            (peVar9->ph_link).phn_prev = peVar7;
          }
          (peVar3->ph_link).phn_lchild = peVar7;
          peVar7 = peVar3;
        }
        else {
          (peVar3->ph_link).phn_prev = peVar7;
          peVar9 = (peVar7->ph_link).phn_lchild;
          (peVar3->ph_link).phn_next = peVar9;
          if (peVar9 != (extent_t *)0x0) {
            (peVar9->ph_link).phn_prev = peVar3;
          }
          (peVar7->ph_link).phn_lchild = peVar3;
          peVar3 = peVar7;
        }
        while (peVar9 = peVar6, peVar9 != (extent_t *)0x0) {
          peVar5 = (peVar9->ph_link).phn_next;
          if (peVar5 == (extent_t *)0x0) {
            peVar6 = (extent_t *)0x0;
          }
          else {
            peVar6 = (peVar5->ph_link).phn_next;
            if (peVar6 != (extent_t *)0x0) {
              (peVar6->ph_link).phn_prev = (extent_t *)0x0;
            }
            (peVar9->ph_link).phn_prev = (extent_t *)0x0;
            (peVar9->ph_link).phn_next = (extent_t *)0x0;
            (peVar5->ph_link).phn_prev = (extent_t *)0x0;
            (peVar5->ph_link).phn_next = (extent_t *)0x0;
            iVar2 = extent_snad_comp(peVar9,peVar5);
            if (iVar2 < 0) {
              (peVar5->ph_link).phn_prev = peVar9;
              peVar1 = (peVar9->ph_link).phn_lchild;
              (peVar5->ph_link).phn_next = peVar1;
              if (peVar1 != (extent_t *)0x0) {
                (peVar1->ph_link).phn_prev = peVar5;
              }
              (peVar9->ph_link).phn_lchild = peVar5;
            }
            else {
              (peVar9->ph_link).phn_prev = peVar5;
              peVar1 = (peVar5->ph_link).phn_lchild;
              (peVar9->ph_link).phn_next = peVar1;
              if (peVar1 != (extent_t *)0x0) {
                (peVar1->ph_link).phn_prev = peVar9;
              }
              (peVar5->ph_link).phn_lchild = peVar9;
              peVar9 = peVar5;
            }
          }
          (peVar7->ph_link).phn_next = peVar9;
          peVar7 = peVar9;
        }
        peVar6 = (peVar3->ph_link).phn_next;
        peVar9 = peVar3;
        if (peVar6 != (extent_t *)0x0) {
          while( true ) {
            peVar3 = peVar9;
            peVar9 = (peVar6->ph_link).phn_next;
            (peVar3->ph_link).phn_next = (extent_t *)0x0;
            (peVar6->ph_link).phn_next = (extent_t *)0x0;
            iVar2 = extent_snad_comp(peVar3,peVar6);
            if (iVar2 < 0) {
              (peVar6->ph_link).phn_prev = peVar3;
              peVar5 = (peVar3->ph_link).phn_lchild;
              (peVar6->ph_link).phn_next = peVar5;
              if (peVar5 != (extent_t *)0x0) {
                (peVar5->ph_link).phn_prev = peVar6;
              }
              (peVar3->ph_link).phn_lchild = peVar6;
            }
            else {
              (peVar3->ph_link).phn_prev = peVar6;
              peVar5 = (peVar6->ph_link).phn_lchild;
              (peVar3->ph_link).phn_next = peVar5;
              if (peVar5 != (extent_t *)0x0) {
                (peVar5->ph_link).phn_prev = peVar3;
              }
              (peVar6->ph_link).phn_lchild = peVar3;
              peVar3 = peVar6;
            }
            if (peVar9 == (extent_t *)0x0) break;
            (peVar7->ph_link).phn_next = peVar3;
            peVar6 = (peVar9->ph_link).phn_next;
            peVar7 = peVar3;
          }
        }
        if (phn != (extent_t *)0x0) goto LAB_001224f7;
      }
      ph->ph_root = peVar3;
      peVar4 = peVar3;
    }
LAB_00122544:
    if (peVar4 == phn) {
      peVar4 = (peVar4->ph_link).phn_lchild;
      if (peVar4 == (extent_t *)0x0) {
        peVar4 = (extent_t *)0x0;
      }
      else {
        peVar3 = (peVar4->ph_link).phn_next;
        if (peVar3 != (extent_t *)0x0) {
          peVar7 = (peVar3->ph_link).phn_next;
          if (peVar7 != (extent_t *)0x0) {
            (peVar7->ph_link).phn_prev = (extent_t *)0x0;
          }
          (peVar4->ph_link).phn_prev = (extent_t *)0x0;
          (peVar4->ph_link).phn_next = (extent_t *)0x0;
          (peVar3->ph_link).phn_prev = (extent_t *)0x0;
          (peVar3->ph_link).phn_next = (extent_t *)0x0;
          iVar2 = extent_snad_comp(peVar4,peVar3);
          if (iVar2 < 0) {
            (peVar3->ph_link).phn_prev = peVar4;
            peVar6 = (peVar4->ph_link).phn_lchild;
            (peVar3->ph_link).phn_next = peVar6;
            if (peVar6 != (extent_t *)0x0) {
              (peVar6->ph_link).phn_prev = peVar3;
            }
            (peVar4->ph_link).phn_lchild = peVar3;
            peVar3 = peVar4;
          }
          else {
            (peVar4->ph_link).phn_prev = peVar3;
            peVar6 = (peVar3->ph_link).phn_lchild;
            (peVar4->ph_link).phn_next = peVar6;
            if (peVar6 != (extent_t *)0x0) {
              (peVar6->ph_link).phn_prev = peVar4;
            }
            (peVar3->ph_link).phn_lchild = peVar4;
            peVar4 = peVar3;
          }
          while (peVar7 != (extent_t *)0x0) {
            peVar6 = (peVar7->ph_link).phn_next;
            if (peVar6 == (extent_t *)0x0) {
              peVar9 = (extent_t *)0x0;
            }
            else {
              peVar9 = (peVar6->ph_link).phn_next;
              if (peVar9 != (extent_t *)0x0) {
                (peVar9->ph_link).phn_prev = (extent_t *)0x0;
              }
              (peVar7->ph_link).phn_prev = (extent_t *)0x0;
              (peVar7->ph_link).phn_next = (extent_t *)0x0;
              (peVar6->ph_link).phn_prev = (extent_t *)0x0;
              (peVar6->ph_link).phn_next = (extent_t *)0x0;
              iVar2 = extent_snad_comp(peVar7,peVar6);
              if (iVar2 < 0) {
                (peVar6->ph_link).phn_prev = peVar7;
                peVar5 = (peVar7->ph_link).phn_lchild;
                (peVar6->ph_link).phn_next = peVar5;
                if (peVar5 != (extent_t *)0x0) {
                  (peVar5->ph_link).phn_prev = peVar6;
                }
                (peVar7->ph_link).phn_lchild = peVar6;
              }
              else {
                (peVar7->ph_link).phn_prev = peVar6;
                peVar5 = (peVar6->ph_link).phn_lchild;
                (peVar7->ph_link).phn_next = peVar5;
                if (peVar5 != (extent_t *)0x0) {
                  (peVar5->ph_link).phn_prev = peVar7;
                }
                (peVar6->ph_link).phn_lchild = peVar7;
                peVar7 = peVar6;
              }
            }
            (peVar3->ph_link).phn_next = peVar7;
            peVar3 = peVar7;
            peVar7 = peVar9;
          }
          peVar7 = (peVar4->ph_link).phn_next;
          peVar6 = peVar4;
          if (peVar7 != (extent_t *)0x0) {
            while( true ) {
              peVar4 = peVar6;
              peVar6 = (peVar7->ph_link).phn_next;
              (peVar4->ph_link).phn_next = (extent_t *)0x0;
              (peVar7->ph_link).phn_next = (extent_t *)0x0;
              iVar2 = extent_snad_comp(peVar4,peVar7);
              if (iVar2 < 0) {
                (peVar7->ph_link).phn_prev = peVar4;
                peVar9 = (peVar4->ph_link).phn_lchild;
                (peVar7->ph_link).phn_next = peVar9;
                if (peVar9 != (extent_t *)0x0) {
                  (peVar9->ph_link).phn_prev = peVar7;
                }
                (peVar4->ph_link).phn_lchild = peVar7;
              }
              else {
                (peVar4->ph_link).phn_prev = peVar7;
                peVar9 = (peVar7->ph_link).phn_lchild;
                (peVar4->ph_link).phn_next = peVar9;
                if (peVar9 != (extent_t *)0x0) {
                  (peVar9->ph_link).phn_prev = peVar4;
                }
                (peVar7->ph_link).phn_lchild = peVar4;
                peVar4 = peVar7;
              }
              if (peVar6 == (extent_t *)0x0) break;
              (peVar3->ph_link).phn_next = peVar4;
              peVar7 = (peVar6->ph_link).phn_next;
              peVar3 = peVar4;
            }
          }
        }
      }
      ph->ph_root = peVar4;
      return;
    }
  }
  peVar4 = (phn->ph_link).phn_prev;
  if (peVar4 == (extent_t *)0x0) {
    peVar3 = (phn->ph_link).phn_lchild;
    if (peVar3 != (extent_t *)0x0) {
      peVar7 = (extent_t *)0x0;
      goto LAB_001221c0;
    }
  }
  else {
    peVar7 = (extent_t *)0x0;
    if ((peVar4->ph_link).phn_lchild == phn) {
      peVar7 = peVar4;
    }
    peVar3 = (phn->ph_link).phn_lchild;
    if (peVar3 != (extent_t *)0x0) {
LAB_001221c0:
      peVar4 = (peVar3->ph_link).phn_next;
      peVar6 = peVar3;
      if (peVar4 != (extent_t *)0x0) {
        peVar9 = (peVar4->ph_link).phn_next;
        if (peVar9 != (extent_t *)0x0) {
          (peVar9->ph_link).phn_prev = (extent_t *)0x0;
        }
        (peVar3->ph_link).phn_prev = (extent_t *)0x0;
        (peVar3->ph_link).phn_next = (extent_t *)0x0;
        (peVar4->ph_link).phn_prev = (extent_t *)0x0;
        (peVar4->ph_link).phn_next = (extent_t *)0x0;
        iVar2 = extent_snad_comp(peVar3,peVar4);
        if (iVar2 < 0) {
          (peVar4->ph_link).phn_prev = peVar3;
          peVar5 = (peVar3->ph_link).phn_lchild;
          (peVar4->ph_link).phn_next = peVar5;
          if (peVar5 != (extent_t *)0x0) {
            (peVar5->ph_link).phn_prev = peVar4;
          }
          (peVar3->ph_link).phn_lchild = peVar4;
        }
        else {
          (peVar3->ph_link).phn_prev = peVar4;
          peVar6 = (peVar4->ph_link).phn_lchild;
          (peVar3->ph_link).phn_next = peVar6;
          if (peVar6 != (extent_t *)0x0) {
            (peVar6->ph_link).phn_prev = peVar3;
          }
          (peVar4->ph_link).phn_lchild = peVar3;
          peVar3 = peVar4;
          peVar6 = peVar4;
        }
        while (peVar9 != (extent_t *)0x0) {
          peVar4 = (peVar9->ph_link).phn_next;
          if (peVar4 == (extent_t *)0x0) {
            peVar5 = (extent_t *)0x0;
          }
          else {
            peVar5 = (peVar4->ph_link).phn_next;
            if (peVar5 != (extent_t *)0x0) {
              (peVar5->ph_link).phn_prev = (extent_t *)0x0;
            }
            (peVar9->ph_link).phn_prev = (extent_t *)0x0;
            (peVar9->ph_link).phn_next = (extent_t *)0x0;
            (peVar4->ph_link).phn_prev = (extent_t *)0x0;
            (peVar4->ph_link).phn_next = (extent_t *)0x0;
            iVar2 = extent_snad_comp(peVar9,peVar4);
            if (iVar2 < 0) {
              (peVar4->ph_link).phn_prev = peVar9;
              peVar1 = (peVar9->ph_link).phn_lchild;
              (peVar4->ph_link).phn_next = peVar1;
              if (peVar1 != (extent_t *)0x0) {
                (peVar1->ph_link).phn_prev = peVar4;
              }
              (peVar9->ph_link).phn_lchild = peVar4;
            }
            else {
              (peVar9->ph_link).phn_prev = peVar4;
              peVar1 = (peVar4->ph_link).phn_lchild;
              (peVar9->ph_link).phn_next = peVar1;
              if (peVar1 != (extent_t *)0x0) {
                (peVar1->ph_link).phn_prev = peVar9;
              }
              (peVar4->ph_link).phn_lchild = peVar9;
              peVar9 = peVar4;
            }
          }
          (peVar3->ph_link).phn_next = peVar9;
          peVar3 = peVar9;
          peVar9 = peVar5;
        }
        peVar4 = (peVar6->ph_link).phn_next;
        if (peVar4 != (extent_t *)0x0) {
          while( true ) {
            peVar9 = (peVar4->ph_link).phn_next;
            (peVar6->ph_link).phn_next = (extent_t *)0x0;
            (peVar4->ph_link).phn_next = (extent_t *)0x0;
            iVar2 = extent_snad_comp(peVar6,peVar4);
            if (iVar2 < 0) {
              (peVar4->ph_link).phn_prev = peVar6;
              peVar5 = (peVar6->ph_link).phn_lchild;
              (peVar4->ph_link).phn_next = peVar5;
              if (peVar5 != (extent_t *)0x0) {
                (peVar5->ph_link).phn_prev = peVar4;
              }
              (peVar6->ph_link).phn_lchild = peVar4;
            }
            else {
              (peVar6->ph_link).phn_prev = peVar4;
              peVar5 = (peVar4->ph_link).phn_lchild;
              (peVar6->ph_link).phn_next = peVar5;
              if (peVar5 != (extent_t *)0x0) {
                (peVar5->ph_link).phn_prev = peVar6;
              }
              (peVar4->ph_link).phn_lchild = peVar6;
              peVar6 = peVar4;
            }
            if (peVar9 == (extent_t *)0x0) break;
            (peVar3->ph_link).phn_next = peVar6;
            peVar4 = (peVar9->ph_link).phn_next;
            peVar3 = peVar6;
            peVar6 = peVar9;
          }
        }
      }
      if (peVar7 == (extent_t *)0x0) {
        peVar4 = (phn->ph_link).phn_prev;
        (peVar6->ph_link).phn_prev = peVar4;
        if (peVar4 == (extent_t *)0x0) goto LAB_001223a3;
        ppeVar8 = &(peVar4->ph_link).phn_next;
      }
      else {
        (peVar6->ph_link).phn_prev = peVar7;
        ppeVar8 = &(peVar7->ph_link).phn_lchild;
      }
      *ppeVar8 = peVar6;
LAB_001223a3:
      peVar4 = (phn->ph_link).phn_next;
      (peVar6->ph_link).phn_next = peVar4;
      if (peVar4 == (extent_t *)0x0) {
        return;
      }
      (peVar4->ph_link).phn_prev = peVar6;
      return;
    }
    if (peVar7 != (extent_t *)0x0) {
      peVar3 = (phn->ph_link).phn_next;
      (peVar7->ph_link).phn_lchild = peVar3;
      if (peVar3 == (extent_t *)0x0) {
        return;
      }
      (peVar3->ph_link).phn_prev = peVar7;
      goto LAB_00122233;
    }
  }
  peVar3 = (phn->ph_link).phn_next;
  (peVar4->ph_link).phn_next = peVar3;
  if (peVar3 == (extent_t *)0x0) {
    return;
  }
LAB_00122233:
  (peVar3->ph_link).phn_prev = (phn->ph_link).phn_prev;
  return;
}

Assistant:

bool
extents_init(tsdn_t *tsdn, extents_t *extents, extent_state_t state,
    bool delay_coalesce) {
	if (malloc_mutex_init(&extents->mtx, "extents", WITNESS_RANK_EXTENTS,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}
	for (unsigned i = 0; i < SC_NPSIZES + 1; i++) {
		extent_heap_new(&extents->heaps[i]);
	}
	bitmap_init(extents->bitmap, &extents_bitmap_info, true);
	extent_list_init(&extents->lru);
	atomic_store_zu(&extents->npages, 0, ATOMIC_RELAXED);
	extents->state = state;
	extents->delay_coalesce = delay_coalesce;
	return false;
}